

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

bool __thiscall
cmdline::parser::option_with_value<unsigned_long>::set
          (option_with_value<unsigned_long> *this,string *value)

{
  long lVar1;
  undefined8 in_RSI;
  long *in_RDI;
  exception *e;
  
  lVar1 = (**(code **)(*in_RDI + 0x60))(in_RDI,in_RSI);
  in_RDI[0xc] = lVar1;
  *(undefined1 *)(in_RDI + 10) = 1;
  return true;
}

Assistant:

bool set(const std::string& value) {
            try {
                actual = read(value);
                has = true;
            } catch (const std::exception& e) {
                return false;
            }
            return true;
        }